

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O0

ssize_t __thiscall Tag::read(Tag *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  StreamObjectVector *pSVar8;
  reference ppSVar9;
  undefined4 extraout_var;
  size_type sVar10;
  undefined8 uVar11;
  undefined4 in_register_00000034;
  uint local_25c;
  StreamObject *pSStack_258;
  uint i_1;
  StreamObject *obj;
  int local_248;
  int i;
  int j;
  int offset;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  int local_1dc;
  undefined1 local_1d8 [8];
  string s;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [376];
  int local_20;
  byte local_19;
  int numberOfElements;
  bool success;
  stringstream *f_local;
  Tag *this_local;
  
  _numberOfElements = (stringstream *)CONCAT44(in_register_00000034,__fd);
  local_19 = 1;
  this->_numberOfLines = 0;
  f_local = (stringstream *)this;
  local_19 = getOpenTag(this,_numberOfElements);
  local_20 = 0;
  std::__cxx11::stringstream::stringstream(local_1a8);
  do {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::__cxx11::string::string((string *)local_1d8);
    std::operator>>((istream *)_numberOfElements,(string *)local_1d8);
    bVar2 = getCloseTag(this,(string *)local_1d8);
    if (bVar2) {
      local_1dc = 3;
    }
    else {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_1d8);
      if (*pcVar6 == '<') {
        std::__cxx11::string::size();
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_1d8);
        if (*pcVar6 != '>') goto LAB_0010a074;
LAB_0010a09e:
        std::__cxx11::stringstream::str();
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1d8,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        if (bVar2) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Syntax error: \"</");
          StreamObject::getName_abi_cxx11_(&local_220,&this->super_StreamObject);
          poVar7 = std::operator<<(poVar7,(string *)&local_220);
          poVar7 = std::operator<<(poVar7,">\" missing.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_220);
          local_19 = 0;
          local_1dc = 3;
          goto LAB_0010a1e9;
        }
      }
      else {
LAB_0010a074:
        bVar1 = std::ios::eof();
        if ((bVar1 & 1) != 0) goto LAB_0010a09e;
        poVar7 = std::operator<<(local_198,(string *)local_1d8);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_20 = local_20 + 1;
      }
      local_1dc = 0;
    }
LAB_0010a1e9:
    std::__cxx11::string::~string((string *)local_1d8);
  } while (local_1dc == 0);
  iVar4 = local_20;
  if ((local_19 & 1) != 0) {
    iVar3 = lineSize(this);
    iVar5 = local_20;
    if (iVar4 % iVar3 == 0) {
      iVar4 = lineSize(this);
      this->_numberOfLines = iVar5 / iVar4;
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Syntax error: wrong number of elements in \"<"
                              );
      StreamObject::getName_abi_cxx11_((string *)&j,&this->super_StreamObject);
      poVar7 = std::operator<<(poVar7,(string *)&j);
      poVar7 = std::operator<<(poVar7,">\"-Tag.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&j);
      local_19 = 0;
    }
  }
  if ((local_19 & 1) != 0) {
    i = 0;
    for (local_248 = 1; local_248 < this->_numberOfLines; local_248 = local_248 + 1) {
      for (obj._4_4_ = 0; iVar4 = obj._4_4_, iVar5 = lineSize(this), iVar4 < iVar5;
          obj._4_4_ = obj._4_4_ + 1) {
        pSVar8 = elements(this);
        ppSVar9 = std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::operator[]
                            (pSVar8,(long)obj._4_4_);
        iVar4 = (*(*ppSVar9)->_vptr_StreamObject[2])();
        pSStack_258 = (StreamObject *)CONCAT44(extraout_var,iVar4);
        iVar4 = lineSize(this);
        i = iVar4 * local_248;
        StreamObject::setOffset(pSStack_258,i + obj._4_4_);
        pSVar8 = elements(this);
        std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::push_back
                  (pSVar8,&stack0xfffffffffffffda8);
      }
    }
    local_25c = 0;
    while( true ) {
      pSVar8 = elements(this);
      sVar10 = std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::size(pSVar8);
      if ((sVar10 <= local_25c) || ((local_19 & 1) == 0)) break;
      ppSVar9 = std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::operator[]
                          (&this->_streamObjects,(ulong)local_25c);
      iVar4 = (*(*ppSVar9)->_vptr_StreamObject[1])(*ppSVar9,local_1a8);
      local_19 = (byte)iVar4 & 1;
      local_25c = local_25c + 1;
    }
  }
  if ((local_19 & 1) != 0) {
    iVar4 = (*(this->super_StreamObject)._vptr_StreamObject[3])();
    local_19 = (byte)iVar4 & 1;
  }
  if ((local_19 & 1) != 0) {
    Object::setInitState(&(this->super_StreamObject).super_Object,true);
  }
  bVar1 = local_19;
  local_1dc = 1;
  uVar11 = std::__cxx11::stringstream::~stringstream(local_1a8);
  return CONCAT71((int7)((ulong)uVar11 >> 8),bVar1) & 0xffffffffffffff01;
}

Assistant:

bool Tag::read( std::stringstream &f )
{
	bool success = true;

	_numberOfLines = 0;

	success = getOpenTag( f );

	int numberOfElements = 0;

	std::stringstream stream;

	while ( ! f.eof() )
	{
		std::string s;
		f >> s;
		if ( getCloseTag( s ) )
		{
			break;
		}
		else
		{
			if (( s[0] == '<' ) && ( s[s.size()-1] == '>' ) || f.eof() )
			{
				if ( s != stream.str() )
				{
					std::cerr << "Syntax error: \"</" << getName() << ">\" missing." << std::endl;
					success = false;
					break;
				}
			}
			else
			{
				stream << s << std::endl;
				numberOfElements++;
			}
		}
	}

	if ( success )
	{
		if ( numberOfElements % lineSize() == 0 )
		{
			_numberOfLines = numberOfElements / lineSize();
		}
		else
		{
			std::cerr << "Syntax error: wrong number of elements in \"<" << getName() << ">\"-Tag." << std::endl;
			success = false;
		}
	}

	if ( success )
	{

		int offset = 0;

		for ( int j = 1; j < _numberOfLines; j++ )
		{
			for ( int i = 0; i < lineSize();i++ )
			{
				StreamObject *obj = elements()[i]->getInstance();

				offset = lineSize() * j;

				obj->setOffset( offset + i );

				elements().push_back( obj );
			}
		}

		for ( unsigned int i = 0; i < elements().size(); i++ )
		{
			if ( success )
			{
				success = _streamObjects[i]->read( stream );
			}
			else
			{
				break;
			}
		}
	}

	if ( success )
	{
		success = verify();
	}

	if ( success )
	{
		setInitState( true );
	}

	return success;
}